

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_dirty_update_set_immutable
               (filemgr *file,filemgr_dirty_update_node *prev_node,filemgr_dirty_update_node *node)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  void *pvVar6;
  avl_node *in_RDX;
  long in_RSI;
  long in_RDI;
  void *addr;
  filemgr_dirty_update_block query;
  filemgr_dirty_update_block *block_copy;
  filemgr_dirty_update_block *block;
  avl_node *bb;
  avl_node *aa;
  bool migration;
  list_elem *le;
  list remove_queue;
  filemgr_dirty_update_node *cur_node;
  avl_node *a;
  memory_order in_stack_ffffffffffffff5c;
  atomic<unsigned_int> *in_stack_ffffffffffffff60;
  filemgr_dirty_update_node *in_stack_ffffffffffffff68;
  filemgr *in_stack_ffffffffffffff70;
  filemgr *in_stack_ffffffffffffff78;
  avl_node *in_stack_ffffffffffffff80;
  avl_node *in_stack_ffffffffffffff88;
  avl_tree *in_stack_ffffffffffffff90;
  avl_node *local_50;
  list_elem *local_40;
  list local_38;
  avl_node *local_28;
  avl_node *local_20;
  avl_node *local_18;
  long local_10;
  long local_8;
  
  if (in_RDX != (avl_node *)0x0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    list_init(&local_38);
    pthread_spin_lock((pthread_spinlock_t *)(local_8 + 0x2d0));
    *(undefined1 *)&local_18[1].left = 1;
    if (local_10 != 0) {
      bVar1 = false;
      if (((*(byte *)(local_10 + 0x20) & 1) != 0) &&
         (uVar2 = atomic_get_uint32_t(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
         uVar2 == 1)) {
        bVar1 = true;
      }
      if ((*(byte *)(local_10 + 0x21) & 1) == 0) {
        paVar4 = avl_first((avl_tree *)(local_10 + 0x38));
      }
      else {
        local_50 = (avl_node *)0x0;
        paVar4 = local_50;
      }
      while (local_50 = paVar4, local_50 != (avl_node *)0x0) {
        paVar4 = avl_next(local_50);
        if ((((ulong)local_50[1].right & 1) == 0) &&
           (iVar3 = filemgr_is_writable(in_stack_ffffffffffffff78,(bid_t)in_stack_ffffffffffffff70),
           iVar3 != 0)) {
          in_stack_ffffffffffffff88 = local_50[1].left;
          paVar5 = avl_search((avl_tree *)in_stack_ffffffffffffff78,
                              (avl_node *)in_stack_ffffffffffffff70,
                              (avl_cmp_func *)in_stack_ffffffffffffff68);
          if (paVar5 == (avl_node *)0x0) {
            if (bVar1) {
              avl_remove(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            }
            else {
              pvVar6 = calloc(1,0x30);
              iVar3 = posix_memalign((void **)&stack0xffffffffffffff60,0x200,
                                     (ulong)*(uint *)(local_8 + 0x10));
              if (iVar3 != 0) {
                in_stack_ffffffffffffff60 = (atomic<unsigned_int> *)0x0;
              }
              *(atomic<unsigned_int> **)((long)pvVar6 + 0x18) = in_stack_ffffffffffffff60;
              *(avl_node **)((long)pvVar6 + 0x20) = local_50[1].left;
              *(byte *)((long)pvVar6 + 0x28) = *(byte *)&local_50[1].right & 1;
              memcpy(*(void **)((long)pvVar6 + 0x18),local_50[1].parent,
                     (ulong)*(uint *)(local_8 + 0x10));
            }
            avl_insert((avl_tree *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                       (avl_cmp_func *)in_stack_ffffffffffffff78);
          }
        }
        else {
          *(undefined1 *)&local_50[1].right = 1;
        }
      }
      *(undefined1 *)(local_10 + 0x21) = 1;
    }
    *(avl_node **)(local_8 + 0x2c8) = local_18;
    local_20 = avl_first((avl_tree *)(local_8 + 0x2b0));
    while ((local_20 != (avl_node *)0x0 && (local_28 = local_20, local_20 != local_18))) {
      local_20 = avl_next(local_20);
      if ((((ulong)local_28[1].left & 1) != 0) &&
         ((uVar2 = atomic_get_uint32_t(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
          uVar2 == 0 && (local_28 != local_18)))) {
        avl_remove(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        list_push_front(&local_38,(list_elem *)local_28);
      }
    }
    pthread_spin_unlock((pthread_spinlock_t *)(local_8 + 0x2d0));
    local_40 = list_begin(&local_38);
    while (local_40 != (list_elem *)0x0) {
      local_28 = (avl_node *)local_40;
      local_40 = list_remove(&local_38,local_40);
      _filemgr_dirty_update_remove_node(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void filemgr_dirty_update_set_immutable(struct filemgr *file,
                                        struct filemgr_dirty_update_node *prev_node,
                                        struct filemgr_dirty_update_node *node)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *cur_node;
    struct list remove_queue;
    struct list_elem *le;

    if (!node) {
        return;
    }

    list_init(&remove_queue);

    spin_lock(&file->dirty_update_lock);
    node->immutable = true;

    // absorb all blocks that exist in the previous dirty update
    // but not exist in the current dirty update
    if (prev_node) {
        bool migration = false;
        struct avl_node *aa, *bb;
        struct filemgr_dirty_update_block *block, *block_copy, query;

        if (prev_node->immutable && atomic_get_uint32_t(&prev_node->ref_count) == 1) {
            // only the current thread is referring this dirty update entry.
            // we don't need to copy blocks; just migrate them directly.
            migration = true;
        }

        if (prev_node->expired) {
            // skip already copied node as its blocks are already in
            // the new node or DB file
            aa = NULL;
        } else {
            aa = avl_first(&prev_node->dirty_blocks);
        }

        while (aa) {
            block = _get_entry(aa, struct filemgr_dirty_update_block, avl);
            aa = avl_next(aa);

            if (block->immutable || !filemgr_is_writable(file, block->bid)) {
                // this block is already committed.
                // it can happen when previous dirty update was flushed but
                // was not closed as other handle was still referring it.

                // ignore this block and set the flag to avoid future copy
                // (filemgr_is_writable() alone is not enough because a block
                //  can become writable again due to circular block reuse).
                block->immutable = true;
                continue;
            }

            query.bid = block->bid;
            bb = avl_search(&node->dirty_blocks, &query.avl, _dirty_blocks_cmp);
            if (!bb) {
                // not exist in the current dirty update .. copy (or move) it
                if (migration) {
                    // move
                    avl_remove(&prev_node->dirty_blocks, &block->avl);
                    block_copy = block;
                } else {
                    // copy
                    block_copy = (struct filemgr_dirty_update_block *)
                                 calloc(1, sizeof(struct filemgr_dirty_update_block));
                    void *addr;
                    malloc_align(addr, FDB_SECTOR_SIZE, file->blocksize);
                    block_copy->addr = addr;
                    block_copy->bid = block->bid;
                    block_copy->immutable = block->immutable;
                    memcpy(block_copy->addr, block->addr, file->blocksize);
                }
                avl_insert(&node->dirty_blocks, &block_copy->avl, _dirty_blocks_cmp);
            }
        }

        // now we don't need to copy blocks in this node in the future
        prev_node->expired = true;
    }

    // set latest dirty update
    file->latest_dirty_update = node;

    // remove all previous dirty updates whose ref_count == 0
    // (except for 'node')
    a = avl_first(&file->dirty_update_idx);
    while (a) {
        cur_node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        if (cur_node == node) {
            break;
        }
        a = avl_next(a);
        if (cur_node->immutable && atomic_get_uint32_t(&cur_node->ref_count) == 0 &&
            cur_node != node) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &cur_node->avl);
            list_push_front(&remove_queue, &cur_node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        cur_node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &cur_node->le);
        _filemgr_dirty_update_remove_node(file, cur_node);
    }
}